

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_api.c
# Opt level: O2

WORD32 ihevcd_create(iv_obj_t *ps_codec_obj,void *pv_api_ip,void *pv_api_op)

{
  WORD32 WVar1;
  bool bVar2;
  iv_obj_t *ps_codec_obj_local;
  
  *(undefined4 *)((long)pv_api_op + 4) = 0;
  ps_codec_obj_local = ps_codec_obj;
  WVar1 = ihevcd_allocate_static_bufs
                    (&ps_codec_obj_local,(ihevcd_cxa_create_ip_t *)pv_api_ip,
                     (ihevcd_cxa_create_op_t *)pv_api_op);
  bVar2 = ps_codec_obj_local == (iv_obj_t *)0x0;
  if (bVar2 || WVar1 == 0) {
    ihevcd_init((codec_t *)ps_codec_obj_local->pv_codec_handle);
  }
  else {
    ihevcd_free_static_bufs(ps_codec_obj_local);
    *(undefined4 *)((long)pv_api_op + 4) = 0x4000;
  }
  return (uint)(!bVar2 && WVar1 != 0);
}

Assistant:

WORD32 ihevcd_create(iv_obj_t *ps_codec_obj,
                           void *pv_api_ip,
                           void *pv_api_op)
{

    ihevcd_cxa_create_op_t *ps_create_op;

    WORD32 ret;
    codec_t *ps_codec;
    ps_create_op = (ihevcd_cxa_create_op_t *)pv_api_op;

    ps_create_op->s_ivd_create_op_t.u4_error_code = 0;

    ret = ihevcd_allocate_static_bufs(&ps_codec_obj, pv_api_ip, pv_api_op);

    /* If allocation of some buffer fails, then free buffers allocated till then */
    if((IV_FAIL == ret) && (NULL != ps_codec_obj))
    {
        ihevcd_free_static_bufs(ps_codec_obj);
        ps_create_op->s_ivd_create_op_t.u4_error_code = IVD_MEM_ALLOC_FAILED;
        ps_create_op->s_ivd_create_op_t.u4_error_code = 1 << IVD_FATALERROR;

        return IV_FAIL;
    }
    ps_codec = (codec_t *)ps_codec_obj->pv_codec_handle;
    ret = ihevcd_init(ps_codec);

    TRACE_INIT(NULL);
    STATS_INIT();

    return ret;
}